

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

LevelDetails * __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::StartLevel
          (LevelDetails *__return_storage_ptr__,ValidPolicyGraph *this)

{
  bool bVar1;
  reference this_00;
  mapped_type *this_01;
  LevelDetails local_98;
  undefined1 local_49;
  type *local_48;
  type *node;
  type *policy;
  _Self local_30;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  ValidPolicyGraph *this_local;
  LevelDetails *prev_level;
  
  bVar1 = ::std::
          vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
          ::empty(&this->levels_);
  if (!bVar1) {
    this_00 = ::std::
              vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ::back(&this->levels_);
    __end3 = ::std::
             map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
             ::begin(this_00);
    local_30._M_node =
         (_Base_ptr)
         ::std::
         map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
         ::end(this_00);
    while (bVar1 = ::std::operator!=(&__end3,&local_30), bVar1) {
      policy = &::std::
                _Rb_tree_iterator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>
                ::operator*(&__end3)->first;
      node = (type *)::std::
                     get<0ul,bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>
                               ((pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>
                                 *)policy);
      local_48 = ::std::
                 get<1ul,bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>
                           ((pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>
                             *)policy);
      if ((local_48->mapped & 1U) == 0) {
        this_01 = ::std::
                  map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                  ::operator[](&(this->current_level_).expected_policy_map,(key_type *)node);
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                  (this_01,(value_type *)node);
      }
      ::std::
      _Rb_tree_iterator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>
      ::operator++(&__end3);
    }
  }
  local_49 = 0;
  LevelDetails::LevelDetails(__return_storage_ptr__,&this->current_level_);
  ::std::
  vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
  ::emplace_back<>(&this->levels_);
  memset(&local_98,0,0x30);
  ::std::
  map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  ::map(&local_98.expected_policy_map);
  local_98.has_any_policy = false;
  LevelDetails::operator=(&this->current_level_,&local_98);
  LevelDetails::~LevelDetails(&local_98);
  return __return_storage_ptr__;
}

Assistant:

LevelDetails StartLevel() {
    // Finish building expected_policy_map for the previous level.
    if (!levels_.empty()) {
      for (const auto &[policy, node] : levels_.back()) {
        if (!node.mapped) {
          current_level_.expected_policy_map[policy].push_back(policy);
        }
      }
    }

    LevelDetails prev_level = std::move(current_level_);
    levels_.emplace_back();
    current_level_ = LevelDetails{};
    return prev_level;
  }